

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O1

void __thiscall leveldb::Benchmark::ReadSequential(Benchmark *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *pFVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  uint extraout_EAX_06;
  uint extraout_EAX_07;
  uint extraout_EAX_08;
  uint extraout_EAX_09;
  uint extraout_EAX_10;
  uint extraout_EAX_11;
  uint extraout_EAX_12;
  Env *pEVar6;
  undefined4 extraout_var;
  size_t sVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  uint extraout_EDX;
  uint uVar12;
  Benchmark *pBVar13;
  undefined1 *puVar14;
  Benchmark *pBVar15;
  Benchmark *this_00;
  Benchmark *this_01;
  char *unaff_R12;
  ulong unaff_R13;
  int iVar16;
  Benchmark *pBVar17;
  undefined1 auVar18 [16];
  sqlite3_stmt *pStmt;
  string read_str;
  long *plStack_268;
  long lStack_260;
  long lStack_258;
  long lStack_250;
  double dStack_248;
  double dStack_240;
  undefined1 *apuStack_238 [2];
  undefined1 auStack_228 [16];
  long *plStack_218;
  long lStack_210;
  long lStack_208;
  long lStack_200;
  string asStack_1f8 [3];
  Benchmark *pBStack_190;
  char *pcStack_188;
  ulong uStack_180;
  Benchmark *pBStack_178;
  Benchmark *pBStack_170;
  ulong uStack_168;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  Benchmark *apBStack_140 [2];
  undefined1 auStack_130 [16];
  Benchmark *pBStack_120;
  undefined1 auStack_110 [16];
  undefined1 auStack_100 [32];
  char acStack_e0 [104];
  Benchmark *pBStack_78;
  double local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"SELECT * FROM test ORDER BY key","");
  puVar14 = local_40[0];
  uVar3 = sqlite3_prepare_v2(this->db_,local_40[0],0xffffffff,&local_48,0);
  if (uVar3 == 0) {
    if (0 < this->reads_) {
      iVar16 = 0;
      do {
        iVar4 = sqlite3_step(local_48);
        if (iVar4 != 100) break;
        iVar4 = sqlite3_column_bytes(local_48,1);
        puVar14 = (undefined1 *)0x2;
        iVar5 = sqlite3_column_bytes(local_48);
        this->bytes_ = this->bytes_ + (long)(iVar5 + iVar4);
        FinishedSingleOp(this);
        iVar16 = iVar16 + 1;
      } while (iVar16 < this->reads_);
    }
    uVar3 = sqlite3_finalize(local_48);
    if (uVar3 == 0) {
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      return;
    }
  }
  else {
    ReadSequential((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX;
  }
  this_00 = (Benchmark *)(ulong)uVar3;
  ReadSequential(this_00);
  pBVar13 = (Benchmark *)(ulong)extraout_EDX;
  pBStack_120 = (Benchmark *)auStack_110;
  uStack_168 = 0x107163;
  pBStack_78 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&pBStack_120,"SELECT * FROM test WHERE key = ?","");
  auStack_100._0_8_ = auStack_100 + 0x10;
  pBVar17 = (Benchmark *)auStack_100;
  uStack_168 = 0x107187;
  std::__cxx11::string::_M_construct<char_const*>((string *)pBVar17,"BEGIN TRANSACTION;","");
  apBStack_140[0] = (Benchmark *)auStack_130;
  uStack_168 = 0x1071a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)apBStack_140,"END TRANSACTION;","");
  uStack_168 = 0x1071c0;
  pBVar15 = (Benchmark *)auStack_100._0_8_;
  uVar3 = sqlite3_prepare_v2(this_00->db_,auStack_100._0_8_,0xffffffff,&uStack_148,0);
  if (uVar3 == 0) {
    uStack_168 = 0x1071e2;
    pBVar15 = apBStack_140[0];
    uVar3 = sqlite3_prepare_v2(this_00->db_,apBStack_140[0],0xffffffff,&uStack_150,0);
    if (uVar3 != 0) goto LAB_0010742c;
    uStack_168 = 0x107204;
    pBVar15 = pBStack_120;
    uVar3 = sqlite3_prepare_v2(this_00->db_,pBStack_120,0xffffffff,&uStack_158,0);
    if (uVar3 != 0) goto LAB_00107433;
    if (0 < this_00->reads_) {
      unaff_R12 = acStack_e0;
      unaff_R13 = 0;
      do {
        if ((1 < (int)extraout_EDX) && ((FLAGS_transaction & 1) == 0)) {
          uStack_168 = 0x10723a;
          uVar3 = sqlite3_step(uStack_148);
          if (uVar3 == 0x65) {
            uStack_168 = 0x10724d;
            uVar3 = sqlite3_reset(uStack_148);
            if (uVar3 == 0) goto LAB_00107255;
LAB_00107409:
            uStack_168 = 0x107410;
            Read((Benchmark *)(ulong)uVar3);
            uVar3 = extraout_EAX_04;
          }
          uStack_168 = 0x107417;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_05;
LAB_00107417:
          uStack_168 = 0x10741e;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_06;
LAB_0010741e:
          uStack_168 = 0x107425;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_07;
          goto LAB_00107425;
        }
LAB_00107255:
        if (0 < (int)extraout_EDX) {
          pBVar17 = (Benchmark *)0x0;
          do {
            if ((int)puVar14 == 0) {
              uVar9 = (ulong)(uint)((int)pBVar17 + (int)unaff_R13);
            }
            else {
              uVar9 = (ulong)(this_00->rand_).seed_ * 0x41a7;
              uVar3 = (uint)uVar9 & 0x7fffffff;
              iVar16 = (int)(uVar9 >> 0x1f);
              uVar12 = iVar16 + uVar3;
              uVar3 = iVar16 + uVar3 + 0x80000001;
              if (-1 < (int)uVar12) {
                uVar3 = uVar12;
              }
              (this_00->rand_).seed_ = uVar3;
              uVar9 = (ulong)uVar3 % (ulong)(uint)this_00->reads_;
            }
            uStack_168 = 0x1072b7;
            snprintf(unaff_R12,100,"%016d",uVar9);
            pBVar15 = (Benchmark *)0x1;
            uStack_168 = 0x1072d1;
            uVar3 = sqlite3_bind_blob(uStack_158,1,unaff_R12,0x10,0);
            if (uVar3 != 0) {
LAB_001073f4:
              uStack_168 = 0x1073fb;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_01;
LAB_001073fb:
              uStack_168 = 0x107402;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_02;
LAB_00107402:
              uStack_168 = 0x107409;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_03;
              goto LAB_00107409;
            }
            do {
              uStack_168 = 0x1072e3;
              uVar3 = sqlite3_step(uStack_158);
            } while (uVar3 == 100);
            if (uVar3 != 0x65) {
              uStack_168 = 0x1073f4;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_00;
              goto LAB_001073f4;
            }
            uStack_168 = 0x1072fb;
            uVar3 = sqlite3_clear_bindings(uStack_158);
            if (uVar3 != 0) goto LAB_001073fb;
            uStack_168 = 0x10730d;
            uVar3 = sqlite3_reset(uStack_158);
            if (uVar3 != 0) goto LAB_00107402;
            uStack_168 = 0x10731d;
            FinishedSingleOp(this_00);
            uVar3 = (int)pBVar17 + 1;
            pBVar17 = (Benchmark *)(ulong)uVar3;
          } while (uVar3 != extraout_EDX);
        }
        if ((1 < (int)extraout_EDX) && ((FLAGS_transaction & 1) == 0)) {
          uStack_168 = 0x107341;
          uVar3 = sqlite3_step(uStack_150);
          if (uVar3 != 0x65) goto LAB_0010741e;
          uStack_168 = 0x107354;
          uVar3 = sqlite3_reset(uStack_150);
          if (uVar3 != 0) goto LAB_00107417;
        }
        uVar3 = (int)unaff_R13 + extraout_EDX;
        unaff_R13 = (ulong)uVar3;
      } while ((int)uVar3 < this_00->reads_);
    }
    uStack_168 = 0x107373;
    uVar3 = sqlite3_finalize(uStack_158);
    if (uVar3 != 0) goto LAB_0010743a;
    uStack_168 = 0x107385;
    uVar3 = sqlite3_finalize(uStack_148);
    pBVar13 = (Benchmark *)auStack_110;
    this_00 = (Benchmark *)(auStack_100 + 0x10);
    pBVar17 = (Benchmark *)auStack_130;
    if (uVar3 == 0) {
      uStack_168 = 0x1073a6;
      uVar3 = sqlite3_finalize(uStack_150);
      if (uVar3 == 0) {
        if (apBStack_140[0] != pBVar17) {
          uStack_168 = 0x1073bd;
          operator_delete(apBStack_140[0]);
        }
        if ((Benchmark *)auStack_100._0_8_ != this_00) {
          uStack_168 = 0x1073cc;
          operator_delete((void *)auStack_100._0_8_);
        }
        if (pBStack_120 != pBVar13) {
          uStack_168 = 0x1073db;
          operator_delete(pBStack_120);
        }
        return;
      }
      goto LAB_00107448;
    }
  }
  else {
LAB_00107425:
    uStack_168 = 0x10742c;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_08;
LAB_0010742c:
    uStack_168 = 0x107433;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_09;
LAB_00107433:
    uStack_168 = 0x10743a;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_10;
LAB_0010743a:
    uStack_168 = 0x107441;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_11;
  }
  uStack_168 = 0x107448;
  Read((Benchmark *)(ulong)uVar3);
  uVar3 = extraout_EAX_12;
LAB_00107448:
  this_01 = (Benchmark *)(ulong)uVar3;
  uStack_168 = 0x10744f;
  Read(this_01);
  pBStack_190 = pBVar13;
  pcStack_188 = unaff_R12;
  uStack_180 = unaff_R13;
  pBStack_178 = this_00;
  pBStack_170 = pBVar17;
  uStack_168 = (ulong)puVar14 & 0xffffffff;
  pEVar6 = Env::Default();
  iVar16 = (*pEVar6->_vptr_Env[0x15])(pEVar6);
  auVar18._4_4_ = extraout_var;
  auVar18._0_4_ = iVar16;
  auVar18._8_4_ = extraout_var;
  auVar18._12_4_ = 0x45300000;
  dStack_240 = auVar18._8_8_ - 1.9342813113834067e+25;
  if (this_01->done_ < 1) {
    this_01->done_ = 1;
  }
  dStack_248 = (dStack_240 + ((double)CONCAT44(0x43300000,iVar16) - 4503599627370496.0)) * 1e-06;
  if (0 < this_01->bytes_) {
    snprintf((char *)asStack_1f8,100,"%6.1f MB/s",
             ((double)this_01->bytes_ * 9.5367431640625e-07) / (dStack_248 - this_01->start_));
    if ((this_01->message_)._M_string_length == 0) {
      strlen((char *)asStack_1f8);
      std::__cxx11::string::_M_replace((ulong)&this_01->message_,0,(char *)0x0,(ulong)asStack_1f8);
    }
    else {
      apuStack_238[0] = auStack_228;
      sVar7 = strlen((char *)asStack_1f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)apuStack_238,asStack_1f8,(long)&asStack_1f8[0]._M_dataplus._M_p + sVar7);
      plVar8 = (long *)std::__cxx11::string::append((char *)apuStack_238);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        lStack_258 = *plVar10;
        lStack_250 = plVar8[3];
        plStack_268 = &lStack_258;
      }
      else {
        lStack_258 = *plVar10;
        plStack_268 = (long *)*plVar8;
      }
      lStack_260 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&plStack_268,(ulong)(this_01->message_)._M_dataplus._M_p);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        lStack_208 = *plVar10;
        lStack_200 = plVar8[3];
        plStack_218 = &lStack_208;
      }
      else {
        lStack_208 = *plVar10;
        plStack_218 = (long *)*plVar8;
      }
      lStack_210 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this_01->message_,(string *)&plStack_218);
      if (plStack_218 != &lStack_208) {
        operator_delete(plStack_218);
      }
      if (plStack_268 != &lStack_258) {
        operator_delete(plStack_268);
      }
      if (apuStack_238[0] != auStack_228) {
        operator_delete(apuStack_238[0]);
      }
    }
  }
  pFVar2 = _stdout;
  paVar1 = &asStack_1f8[0].field_2;
  asStack_1f8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)asStack_1f8,pBVar15->db_,pBVar15->db_ + *(long *)&pBVar15->db_num_);
  pcVar11 = " ";
  if ((this_01->message_)._M_string_length == 0) {
    pcVar11 = "";
  }
  fprintf(pFVar2,"%-12s : %11.3f micros/op;%s%s\n",
          ((dStack_248 - this_01->start_) * 1000000.0) / (double)this_01->done_,
          asStack_1f8[0]._M_dataplus._M_p,pcVar11,(this_01->message_)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)asStack_1f8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(asStack_1f8[0]._M_dataplus._M_p);
  }
  pFVar2 = _stdout;
  if (FLAGS_histogram == true) {
    Histogram::ToString_abi_cxx11_(asStack_1f8,&this_01->hist_);
    fprintf(pFVar2,"Microseconds per op:\n%s\n",asStack_1f8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)asStack_1f8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(asStack_1f8[0]._M_dataplus._M_p);
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void ReadSequential() {
    int status;
    sqlite3_stmt* pStmt;
    std::string read_str = "SELECT * FROM test ORDER BY key";

    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &pStmt, nullptr);
    ErrorCheck(status);
    for (int i = 0; i < reads_ && SQLITE_ROW == sqlite3_step(pStmt); i++) {
      bytes_ += sqlite3_column_bytes(pStmt, 1) + sqlite3_column_bytes(pStmt, 2);
      FinishedSingleOp();
    }

    status = sqlite3_finalize(pStmt);
    ErrorCheck(status);
  }